

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3VdbeMakeReady(Vdbe *p,Parse *pParse)

{
  byte bVar1;
  short sVar2;
  int iVar3;
  sqlite3 *db;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  Mem *pMVar8;
  void *pvVar9;
  VdbeCursor **ppVVar10;
  byte bVar11;
  long lVar12;
  long lVar13;
  Mem *pMVar14;
  Mem **ppMVar15;
  u64 uVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  size_t sVar23;
  u64 uVar24;
  int *piVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  size_t __n;
  bool bVar29;
  int nArg;
  int local_4c;
  long local_48;
  ulong local_40;
  u8 *local_38;
  
  p->pVList = pParse->pVList;
  pParse->pVList = (VList *)0x0;
  db = p->db;
  sVar2 = pParse->nVar;
  iVar5 = pParse->nTab;
  lVar12 = (long)iVar5;
  local_4c = pParse->nMaxArg;
  iVar17 = pParse->nMem + iVar5;
  lVar6 = (long)(p->nOp * 0x18);
  local_38 = &p->aOp->opcode + lVar6;
  iVar3 = pParse->szOpAlloc;
  resolveP2Values(p,&local_4c);
  if (pParse->isMultiWrite == '\0') {
    bVar11 = 0;
  }
  else {
    bVar11 = (pParse->mayAbort != '\0') << 5;
  }
  iVar17 = iVar17 + (uint)(0 < iVar17 && lVar12 == 0);
  uVar18 = iVar3 - lVar6 & 0xfffffffffffffff8;
  bVar1 = p->field_0xc6;
  p->field_0xc6 = bVar1 & 0xdf | bVar11;
  lVar6 = (long)sVar2;
  if (pParse->explain != 0) {
    if (iVar17 < 0xb) {
      iVar17 = 10;
    }
    p->field_0xc6 = bVar1 & 0xd3 | bVar11 | (pParse->explain & 3) << 2;
    bVar29 = pParse->explain == '\x02';
    uVar22 = (ulong)((uint)bVar29 * 8);
    local_48 = (long)sVar2;
    local_40 = uVar18;
    sqlite3VdbeSetNumCols(p,(uint)!bVar29 * 4 + 4);
    piVar25 = (int *)(sqlite3VdbeMakeReady_azColName_rel + (ulong)bVar29 * 0x20);
    lVar28 = 0;
    do {
      if (p->db->mallocFailed == '\0') {
        sqlite3VdbeMemSetStr
                  ((Mem *)((long)&p->aColName->u + lVar28),
                   sqlite3VdbeMakeReady_azColName_rel + *piVar25,-1,'\x01',
                   (_func_void_void_ptr *)0x0);
      }
      uVar22 = uVar22 + 1;
      piVar25 = piVar25 + 1;
      lVar28 = lVar28 + 0x38;
      uVar18 = local_40;
      lVar6 = local_48;
    } while (uVar22 < (ulong)bVar29 * 4 + 8);
  }
  p->field_0xc6 = p->field_0xc6 & 0xfc;
  lVar7 = (long)iVar17;
  lVar20 = lVar7 * 0x38;
  pMVar8 = (Mem *)0x0;
  uVar22 = uVar18 + lVar7 * -0x38;
  pMVar14 = (Mem *)(local_38 + uVar22);
  lVar28 = 0;
  if (SBORROW8(uVar18,lVar20) != (long)uVar22 < 0) {
    pMVar14 = pMVar8;
    lVar28 = lVar20;
    uVar22 = uVar18;
  }
  p->aMem = pMVar14;
  lVar21 = lVar6 * 0x38;
  uVar18 = uVar22 + lVar6 * -0x38;
  pMVar14 = (Mem *)(local_38 + uVar18);
  lVar4 = 0;
  if (SBORROW8(uVar22,lVar21) != (long)uVar18 < 0) {
    pMVar14 = pMVar8;
    lVar4 = lVar21;
    uVar18 = uVar22;
  }
  p->aVar = pMVar14;
  lVar26 = (long)local_4c;
  lVar27 = lVar26 * 8;
  uVar22 = uVar18 + lVar26 * -8;
  lVar19 = 0;
  if ((long)uVar18 < lVar27) {
    lVar19 = lVar27;
  }
  pMVar14 = (Mem *)(local_38 + uVar22);
  if (SBORROW8(uVar18,lVar27) != (long)uVar22 < 0) {
    pMVar14 = pMVar8;
    uVar22 = uVar18;
  }
  p->apArg = (Mem **)pMVar14;
  __n = lVar12 * 8;
  lVar13 = uVar22 + lVar12 * -8;
  sVar23 = 0;
  if ((long)uVar22 < (long)__n) {
    sVar23 = __n;
  }
  pMVar14 = (Mem *)(local_38 + lVar13);
  if (SBORROW8(uVar22,__n) != lVar13 < 0) {
    pMVar14 = pMVar8;
  }
  p->apCsr = (VdbeCursor **)pMVar14;
  uVar24 = sVar23 + lVar19 + lVar4 + lVar28;
  if (uVar24 != 0) {
    pvVar9 = sqlite3DbMallocRawNN(db,uVar24);
    p->pFree = pvVar9;
    if (db->mallocFailed == '\0') {
      pMVar14 = p->aMem;
      uVar16 = uVar24;
      if (pMVar14 == (Mem *)0x0) {
        uVar16 = uVar24 + lVar7 * -0x38;
        if ((long)uVar24 < lVar20) {
          pMVar14 = (Mem *)0x0;
          uVar16 = uVar24;
        }
        else {
          pMVar14 = (Mem *)((long)pvVar9 + uVar16);
        }
      }
      p->aMem = pMVar14;
      pMVar14 = p->aVar;
      uVar24 = uVar16;
      if (pMVar14 == (Mem *)0x0) {
        uVar24 = uVar16 + lVar6 * -0x38;
        if ((long)uVar16 < lVar21) {
          pMVar14 = (Mem *)0x0;
          uVar24 = uVar16;
        }
        else {
          pMVar14 = (Mem *)((long)pvVar9 + uVar24);
        }
      }
      p->aVar = pMVar14;
      ppMVar15 = p->apArg;
      uVar16 = uVar24;
      if (ppMVar15 == (Mem **)0x0) {
        uVar16 = uVar24 + lVar26 * -8;
        if ((long)uVar24 < lVar27) {
          ppMVar15 = (Mem **)0x0;
          uVar16 = uVar24;
        }
        else {
          ppMVar15 = (Mem **)((long)pvVar9 + uVar16);
        }
      }
      p->apArg = ppMVar15;
      ppVVar10 = p->apCsr;
      if (ppVVar10 == (VdbeCursor **)0x0) {
        if ((long)uVar16 < (long)__n) {
          ppVVar10 = (VdbeCursor **)0x0;
        }
        else {
          ppVVar10 = (VdbeCursor **)((long)pvVar9 + uVar16 + lVar12 * -8);
        }
      }
      p->apCsr = ppVVar10;
    }
  }
  if (db->mallocFailed == '\0') {
    p->nCursor = iVar5;
    p->nVar = sVar2;
    if (0 < sVar2) {
      iVar5 = sVar2 + 1;
      piVar25 = &p->aVar->szMalloc;
      do {
        *(u16 *)(piVar25 + -3) = 1;
        *(sqlite3 **)(piVar25 + -2) = db;
        *piVar25 = 0;
        iVar5 = iVar5 + -1;
        piVar25 = piVar25 + 0xe;
      } while (1 < iVar5);
    }
    p->nMem = iVar17;
    if (0 < iVar17) {
      iVar17 = iVar17 + 1;
      piVar25 = &p->aMem->szMalloc;
      do {
        *(u16 *)(piVar25 + -3) = 0;
        *(sqlite3 **)(piVar25 + -2) = db;
        *piVar25 = 0;
        iVar17 = iVar17 + -1;
        piVar25 = piVar25 + 0xe;
      } while (1 < iVar17);
    }
    memset(p->apCsr,0,__n);
  }
  else {
    p->nVar = 0;
    p->nMem = 0;
    p->nCursor = 0;
  }
  p->eVdbeState = '\x01';
  p->rc = 0;
  p->errorAction = '\x02';
  p->minWriteFileFormat = 0xff;
  p->nChange = 0;
  p->cacheCtr = 1;
  p->pc = -1;
  p->iStatement = 0;
  p->nFkConstraint = 0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMakeReady(
  Vdbe *p,                       /* The VDBE */
  Parse *pParse                  /* Parsing context */
){
  sqlite3 *db;                   /* The database connection */
  int nVar;                      /* Number of parameters */
  int nMem;                      /* Number of VM memory registers */
  int nCursor;                   /* Number of cursors required */
  int nArg;                      /* Number of arguments in subprograms */
  int n;                         /* Loop counter */
  struct ReusableSpace x;        /* Reusable bulk memory */

  assert( p!=0 );
  assert( p->nOp>0 );
  assert( pParse!=0 );
  assert( p->eVdbeState==VDBE_INIT_STATE );
  assert( pParse==p->pParse );
  p->pVList = pParse->pVList;
  pParse->pVList =  0;
  db = p->db;
  assert( db->mallocFailed==0 );
  nVar = pParse->nVar;
  nMem = pParse->nMem;
  nCursor = pParse->nTab;
  nArg = pParse->nMaxArg;

  /* Each cursor uses a memory cell.  The first cursor (cursor 0) can
  ** use aMem[0] which is not otherwise used by the VDBE program.  Allocate
  ** space at the end of aMem[] for cursors 1 and greater.
  ** See also: allocateCursor().
  */
  nMem += nCursor;
  if( nCursor==0 && nMem>0 ) nMem++;  /* Space for aMem[0] even if not used */

  /* Figure out how much reusable memory is available at the end of the
  ** opcode array.  This extra memory will be reallocated for other elements
  ** of the prepared statement.
  */
  n = ROUND8P(sizeof(Op)*p->nOp);             /* Bytes of opcode memory used */
  x.pSpace = &((u8*)p->aOp)[n];               /* Unused opcode memory */
  assert( EIGHT_BYTE_ALIGNMENT(x.pSpace) );
  x.nFree = ROUNDDOWN8(pParse->szOpAlloc - n);  /* Bytes of unused memory */
  assert( x.nFree>=0 );
  assert( EIGHT_BYTE_ALIGNMENT(&x.pSpace[x.nFree]) );

  resolveP2Values(p, &nArg);
  p->usesStmtJournal = (u8)(pParse->isMultiWrite && pParse->mayAbort);
  if( pParse->explain ){
    static const char * const azColName[] = {
       "addr", "opcode", "p1", "p2", "p3", "p4", "p5", "comment",
       "id", "parent", "notused", "detail"
    };
    int iFirst, mx, i;
    if( nMem<10 ) nMem = 10;
    p->explain = pParse->explain;
    if( pParse->explain==2 ){
      sqlite3VdbeSetNumCols(p, 4);
      iFirst = 8;
      mx = 12;
    }else{
      sqlite3VdbeSetNumCols(p, 8);
      iFirst = 0;
      mx = 8;
    }
    for(i=iFirst; i<mx; i++){
      sqlite3VdbeSetColName(p, i-iFirst, COLNAME_NAME,
                            azColName[i], SQLITE_STATIC);
    }
  }
  p->expired = 0;

  /* Memory for registers, parameters, cursor, etc, is allocated in one or two
  ** passes.  On the first pass, we try to reuse unused memory at the
  ** end of the opcode array.  If we are unable to satisfy all memory
  ** requirements by reusing the opcode array tail, then the second
  ** pass will fill in the remainder using a fresh memory allocation.
  **
  ** This two-pass approach that reuses as much memory as possible from
  ** the leftover memory at the end of the opcode array.  This can significantly
  ** reduce the amount of memory held by a prepared statement.
  */
  x.nNeeded = 0;
  p->aMem = allocSpace(&x, 0, nMem*sizeof(Mem));
  p->aVar = allocSpace(&x, 0, nVar*sizeof(Mem));
  p->apArg = allocSpace(&x, 0, nArg*sizeof(Mem*));
  p->apCsr = allocSpace(&x, 0, nCursor*sizeof(VdbeCursor*));
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
  p->anExec = allocSpace(&x, 0, p->nOp*sizeof(i64));
#endif
  if( x.nNeeded ){
    x.pSpace = p->pFree = sqlite3DbMallocRawNN(db, x.nNeeded);
    x.nFree = x.nNeeded;
    if( !db->mallocFailed ){
      p->aMem = allocSpace(&x, p->aMem, nMem*sizeof(Mem));
      p->aVar = allocSpace(&x, p->aVar, nVar*sizeof(Mem));
      p->apArg = allocSpace(&x, p->apArg, nArg*sizeof(Mem*));
      p->apCsr = allocSpace(&x, p->apCsr, nCursor*sizeof(VdbeCursor*));
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
      p->anExec = allocSpace(&x, p->anExec, p->nOp*sizeof(i64));
#endif
    }
  }

  if( db->mallocFailed ){
    p->nVar = 0;
    p->nCursor = 0;
    p->nMem = 0;
  }else{
    p->nCursor = nCursor;
    p->nVar = (ynVar)nVar;
    initMemArray(p->aVar, nVar, db, MEM_Null);
    p->nMem = nMem;
    initMemArray(p->aMem, nMem, db, MEM_Undefined);
    memset(p->apCsr, 0, nCursor*sizeof(VdbeCursor*));
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
    memset(p->anExec, 0, p->nOp*sizeof(i64));
#endif
  }
  sqlite3VdbeRewind(p);
}